

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

PhysicalType __thiscall duckdb::LogicalType::GetInternalType(LogicalType *this)

{
  byte params;
  PhysicalType PVar1;
  InternalException *pIVar2;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  string local_68;
  string local_48;
  
  switch(this->id_) {
  case INVALID:
  case UNKNOWN:
  case ANY:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case TABLE:
  case LAMBDA:
    goto switchD_00e6e4a6_caseD_0;
  case SQLNULL:
  case INTEGER:
  case DATE:
    PVar1 = INT32;
    break;
  case USER:
    PVar1 = UNKNOWN;
    break;
  default:
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid LogicalType %s","");
    ToString_abi_cxx11_(&local_48,this);
    InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_68,&local_48);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    PVar1 = BOOL;
    break;
  case TINYINT:
    PVar1 = INT8;
    break;
  case SMALLINT:
    PVar1 = INT16;
    break;
  case BIGINT:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case TIMESTAMP_TZ:
  case TIME_TZ:
    PVar1 = INT64;
    break;
  case DECIMAL:
    local_68._M_dataplus._M_p =
         (pointer)(this->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_68._M_dataplus._M_p != (element_type *)0x0) {
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_68);
      params = *(byte *)&((element_type *)(local_68._M_dataplus._M_p + 0x38))->_vptr_ExtraTypeInfo;
      if (params < 5) {
        return INT16;
      }
      if (params < 10) {
        return INT32;
      }
      if (params < 0x13) {
        return INT64;
      }
      if (params < 0x27) {
        return INT128;
      }
      pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Decimal has a width of %d which is bigger than the maximum supported width of %d",
                 "");
      InternalException::InternalException<unsigned_char,unsigned_char>(pIVar2,&local_68,params,'&')
      ;
      __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto switchD_00e6e4a6_caseD_0;
  case FLOAT:
    PVar1 = FLOAT;
    break;
  case DOUBLE:
    PVar1 = DOUBLE;
    break;
  case CHAR:
  case VARCHAR:
  case BLOB:
  case BIT:
  case VARINT:
  case AGGREGATE_STATE:
    PVar1 = VARCHAR;
    break;
  case INTERVAL:
    PVar1 = INTERVAL;
    break;
  case UTINYINT:
    PVar1 = UINT8;
    break;
  case USMALLINT:
    PVar1 = UINT16;
    break;
  case UINTEGER:
    PVar1 = UINT32;
    break;
  case UBIGINT:
  case POINTER:
    PVar1 = UINT64;
    break;
  case UHUGEINT:
    PVar1 = UINT128;
    break;
  case HUGEINT:
  case UUID:
    PVar1 = INT128;
    break;
  case VALIDITY:
    PVar1 = BIT;
    break;
  case STRUCT:
  case UNION:
    PVar1 = STRUCT;
    break;
  case LIST:
  case MAP:
    PVar1 = LIST;
    break;
  case ENUM:
    if ((this->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      PVar1 = EnumType::GetPhysicalType(this);
      return PVar1;
    }
switchD_00e6e4a6_caseD_0:
    PVar1 = INVALID;
    break;
  case ARRAY:
    PVar1 = ARRAY;
  }
  return PVar1;
}

Assistant:

PhysicalType LogicalType::GetInternalType() {
	switch (id_) {
	case LogicalTypeId::BOOLEAN:
		return PhysicalType::BOOL;
	case LogicalTypeId::TINYINT:
		return PhysicalType::INT8;
	case LogicalTypeId::UTINYINT:
		return PhysicalType::UINT8;
	case LogicalTypeId::SMALLINT:
		return PhysicalType::INT16;
	case LogicalTypeId::USMALLINT:
		return PhysicalType::UINT16;
	case LogicalTypeId::SQLNULL:
	case LogicalTypeId::DATE:
	case LogicalTypeId::INTEGER:
		return PhysicalType::INT32;
	case LogicalTypeId::UINTEGER:
		return PhysicalType::UINT32;
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::TIMESTAMP_TZ:
		return PhysicalType::INT64;
	case LogicalTypeId::UBIGINT:
		return PhysicalType::UINT64;
	case LogicalTypeId::UHUGEINT:
		return PhysicalType::UINT128;
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return PhysicalType::INT128;
	case LogicalTypeId::FLOAT:
		return PhysicalType::FLOAT;
	case LogicalTypeId::DOUBLE:
		return PhysicalType::DOUBLE;
	case LogicalTypeId::DECIMAL: {
		if (!type_info_) {
			return PhysicalType::INVALID;
		}
		auto width = DecimalType::GetWidth(*this);
		if (width <= Decimal::MAX_WIDTH_INT16) {
			return PhysicalType::INT16;
		} else if (width <= Decimal::MAX_WIDTH_INT32) {
			return PhysicalType::INT32;
		} else if (width <= Decimal::MAX_WIDTH_INT64) {
			return PhysicalType::INT64;
		} else if (width <= Decimal::MAX_WIDTH_INT128) {
			return PhysicalType::INT128;
		} else {
			throw InternalException("Decimal has a width of %d which is bigger than the maximum supported width of %d",
			                        width, DecimalType::MaxWidth());
		}
	}
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::CHAR:
	case LogicalTypeId::BLOB:
	case LogicalTypeId::BIT:
	case LogicalTypeId::VARINT:
		return PhysicalType::VARCHAR;
	case LogicalTypeId::INTERVAL:
		return PhysicalType::INTERVAL;
	case LogicalTypeId::UNION:
	case LogicalTypeId::STRUCT:
		return PhysicalType::STRUCT;
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return PhysicalType::LIST;
	case LogicalTypeId::ARRAY:
		return PhysicalType::ARRAY;
	case LogicalTypeId::POINTER:
		// LCOV_EXCL_START
		if (sizeof(uintptr_t) == sizeof(uint32_t)) {
			return PhysicalType::UINT32;
		} else if (sizeof(uintptr_t) == sizeof(uint64_t)) {
			return PhysicalType::UINT64;
		} else {
			throw InternalException("Unsupported pointer size");
		}
		// LCOV_EXCL_STOP
	case LogicalTypeId::VALIDITY:
		return PhysicalType::BIT;
	case LogicalTypeId::ENUM: {
		if (!type_info_) {
			return PhysicalType::INVALID;
		}
		return EnumType::GetPhysicalType(*this);
	}
	case LogicalTypeId::TABLE:
	case LogicalTypeId::LAMBDA:
	case LogicalTypeId::ANY:
	case LogicalTypeId::INVALID:
	case LogicalTypeId::UNKNOWN:
	case LogicalTypeId::STRING_LITERAL:
	case LogicalTypeId::INTEGER_LITERAL:
		return PhysicalType::INVALID;
	case LogicalTypeId::USER:
		return PhysicalType::UNKNOWN;
	case LogicalTypeId::AGGREGATE_STATE:
		return PhysicalType::VARCHAR;
	default:
		throw InternalException("Invalid LogicalType %s", ToString());
	}
}